

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O2

ptr __thiscall
agge::tests::mocks::create_font<3ul,2ul>
          (mocks *this,font_metrics *metrics_,char_to_index (*indices) [3],glyph (*glyphs) [2])

{
  font *this_00;
  font_accessor *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr pVar1;
  accessor_ptr local_40;
  
  this_00 = (font *)operator_new(0x498);
  this_01 = (font_accessor *)operator_new(0xb0);
  font_accessor::font_accessor<3ul,2ul>(this_01,metrics_,indices,glyphs);
  std::__shared_ptr<agge::font::accessor,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<agge::tests::mocks::font_accessor,void>
            ((__shared_ptr<agge::font::accessor,(__gnu_cxx::_Lock_policy)2> *)&local_40,this_01);
  font::font(this_00,&local_40,1.0);
  std::__shared_ptr<agge::font,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<agge::font,void>
            ((__shared_ptr<agge::font,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<agge::font::accessor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pVar1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr)pVar1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline font::ptr create_font(const font_metrics &metrics_,
				const font_accessor::char_to_index (&indices)[indices_n], font_accessor::glyph (&glyphs)[glyphs_n])
			{	return font::ptr(new font(font::accessor_ptr(new font_accessor(metrics_, indices, glyphs))));	}